

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRasterizationTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::anon_unknown_1::LineInterpolationTest::LineInterpolationTest
          (LineInterpolationTest *this,Context *ctx,char *name,char *desc,GLenum primitive,int flags
          ,PrimitiveWideness wideness,RenderTarget renderTarget,int numSamples)

{
  BaseRenderingCase::BaseRenderingCase
            (&this->super_BaseRenderingCase,ctx,name,desc,renderTarget,numSamples,0x100);
  (this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__LineInterpolationTest_00cf6358;
  *(GLenum *)&(this->super_BaseRenderingCase).field_0xc4 = primitive;
  this->m_projective = (bool)((byte)((uint)flags >> 1) & 1);
  this->m_iterationCount = 3;
  this->m_primitiveWideness = wideness;
  this->m_iteration = 0;
  tcu::ResultCollector::ResultCollector(&this->m_result);
  this->m_maxLineWidth = 1.0;
  (this->m_lineWidths).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_lineWidths).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_lineWidths).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_BaseRenderingCase).m_flatshade = (bool)((byte)((uint)flags >> 2) & 1);
  return;
}

Assistant:

LineInterpolationTest::LineInterpolationTest (Context& ctx, const char* name, const char* desc, glw::GLenum primitive, int flags, PrimitiveWideness wideness, RenderTarget renderTarget, int numSamples)
	: BaseRenderingCase		(ctx, name, desc, renderTarget, numSamples, DEFAULT_RENDER_SIZE)
	, m_primitive			(primitive)
	, m_projective			((flags & INTERPOLATIONFLAGS_PROJECTED) != 0)
	, m_iterationCount		(3)
	, m_primitiveWideness	(wideness)
	, m_iteration			(0)
	, m_maxLineWidth		(1.0f)
{
	m_flatshade = ((flags & INTERPOLATIONFLAGS_FLATSHADE) != 0);
}